

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O1

int EncoderInit(VP8LEncoder *enc)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = enc->pic->height * enc->pic->width;
  iVar1 = iVar2 + 0xe;
  if (-1 < iVar2 + -1) {
    iVar1 = iVar2 + -1;
  }
  iVar2 = VP8LHashChainInit(&enc->hash_chain,iVar2);
  if (iVar2 == 0) {
    iVar1 = 0;
  }
  else {
    lVar3 = 0;
    do {
      VP8LBackwardRefsInit
                ((VP8LBackwardRefs *)((long)&enc->refs[0].block_size + lVar3),(iVar1 >> 4) + 1);
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0xa0);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int EncoderInit(VP8LEncoder* const enc) {
  const WebPPicture* const pic = enc->pic;
  const int width = pic->width;
  const int height = pic->height;
  const int pix_cnt = width * height;
  // we round the block size up, so we're guaranteed to have
  // at most MAX_REFS_BLOCK_PER_IMAGE blocks used:
  const int refs_block_size = (pix_cnt - 1) / MAX_REFS_BLOCK_PER_IMAGE + 1;
  int i;
  if (!VP8LHashChainInit(&enc->hash_chain, pix_cnt)) return 0;

  for (i = 0; i < 4; ++i) VP8LBackwardRefsInit(&enc->refs[i], refs_block_size);

  return 1;
}